

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O2

ares_conn_err_t ares_conn_read(ares_conn_t *conn,void *data,size_t len,size_t *read_bytes)

{
  ares_channel_t *channel;
  ares_conn_err_t aVar1;
  ares_bool_t aVar2;
  ares_socklen_t salen;
  sockaddr_storage sa_storage;
  
  channel = conn->server->channel;
  if ((conn->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
    salen = 0x80;
    sa_storage.ss_family = 0;
    sa_storage.__ss_padding[0] = '\0';
    sa_storage.__ss_padding[1] = '\0';
    sa_storage.__ss_padding[2] = '\0';
    sa_storage.__ss_padding[3] = '\0';
    sa_storage.__ss_padding[4] = '\0';
    sa_storage.__ss_padding[5] = '\0';
    sa_storage.__ss_padding[6] = '\0';
    sa_storage.__ss_padding[7] = '\0';
    sa_storage.__ss_padding[8] = '\0';
    sa_storage.__ss_padding[9] = '\0';
    sa_storage.__ss_padding[10] = '\0';
    sa_storage.__ss_padding[0xb] = '\0';
    sa_storage.__ss_padding[0xc] = '\0';
    sa_storage.__ss_padding[0xd] = '\0';
    sa_storage.__ss_padding[0xe] = '\0';
    sa_storage.__ss_padding[0xf] = '\0';
    sa_storage.__ss_padding[0x10] = '\0';
    sa_storage.__ss_padding[0x11] = '\0';
    sa_storage.__ss_padding[0x12] = '\0';
    sa_storage.__ss_padding[0x13] = '\0';
    sa_storage.__ss_padding[0x14] = '\0';
    sa_storage.__ss_padding[0x15] = '\0';
    sa_storage.__ss_padding[0x16] = '\0';
    sa_storage.__ss_padding[0x17] = '\0';
    sa_storage.__ss_padding[0x18] = '\0';
    sa_storage.__ss_padding[0x19] = '\0';
    sa_storage.__ss_padding[0x1a] = '\0';
    sa_storage.__ss_padding[0x1b] = '\0';
    sa_storage.__ss_padding[0x1c] = '\0';
    sa_storage.__ss_padding[0x1d] = '\0';
    sa_storage.__ss_padding[0x1e] = '\0';
    sa_storage.__ss_padding[0x1f] = '\0';
    sa_storage.__ss_padding[0x20] = '\0';
    sa_storage.__ss_padding[0x21] = '\0';
    sa_storage.__ss_padding[0x22] = '\0';
    sa_storage.__ss_padding[0x23] = '\0';
    sa_storage.__ss_padding[0x24] = '\0';
    sa_storage.__ss_padding[0x25] = '\0';
    sa_storage.__ss_padding[0x26] = '\0';
    sa_storage.__ss_padding[0x27] = '\0';
    sa_storage.__ss_padding[0x28] = '\0';
    sa_storage.__ss_padding[0x29] = '\0';
    sa_storage.__ss_padding[0x2a] = '\0';
    sa_storage.__ss_padding[0x2b] = '\0';
    sa_storage.__ss_padding[0x2c] = '\0';
    sa_storage.__ss_padding[0x2d] = '\0';
    sa_storage.__ss_padding[0x2e] = '\0';
    sa_storage.__ss_padding[0x2f] = '\0';
    sa_storage.__ss_padding[0x30] = '\0';
    sa_storage.__ss_padding[0x31] = '\0';
    sa_storage.__ss_padding[0x32] = '\0';
    sa_storage.__ss_padding[0x33] = '\0';
    sa_storage.__ss_padding[0x34] = '\0';
    sa_storage.__ss_padding[0x35] = '\0';
    sa_storage.__ss_padding[0x36] = '\0';
    sa_storage.__ss_padding[0x37] = '\0';
    sa_storage.__ss_padding[0x38] = '\0';
    sa_storage.__ss_padding[0x39] = '\0';
    sa_storage.__ss_padding[0x3a] = '\0';
    sa_storage.__ss_padding[0x3b] = '\0';
    sa_storage.__ss_padding[0x3c] = '\0';
    sa_storage.__ss_padding[0x3d] = '\0';
    sa_storage.__ss_padding[0x3e] = '\0';
    sa_storage.__ss_padding[0x3f] = '\0';
    sa_storage.__ss_padding[0x40] = '\0';
    sa_storage.__ss_padding[0x41] = '\0';
    sa_storage.__ss_padding[0x42] = '\0';
    sa_storage.__ss_padding[0x43] = '\0';
    sa_storage.__ss_padding[0x44] = '\0';
    sa_storage.__ss_padding[0x45] = '\0';
    sa_storage.__ss_padding[0x46] = '\0';
    sa_storage.__ss_padding[0x47] = '\0';
    sa_storage.__ss_padding[0x48] = '\0';
    sa_storage.__ss_padding[0x49] = '\0';
    sa_storage.__ss_padding[0x4a] = '\0';
    sa_storage.__ss_padding[0x4b] = '\0';
    sa_storage.__ss_padding[0x4c] = '\0';
    sa_storage.__ss_padding[0x4d] = '\0';
    sa_storage.__ss_padding[0x4e] = '\0';
    sa_storage.__ss_padding[0x4f] = '\0';
    sa_storage.__ss_padding[0x50] = '\0';
    sa_storage.__ss_padding[0x51] = '\0';
    sa_storage.__ss_padding[0x52] = '\0';
    sa_storage.__ss_padding[0x53] = '\0';
    sa_storage.__ss_padding[0x54] = '\0';
    sa_storage.__ss_padding[0x55] = '\0';
    sa_storage.__ss_padding[0x56] = '\0';
    sa_storage.__ss_padding[0x57] = '\0';
    sa_storage.__ss_padding[0x58] = '\0';
    sa_storage.__ss_padding[0x59] = '\0';
    sa_storage.__ss_padding[0x5a] = '\0';
    sa_storage.__ss_padding[0x5b] = '\0';
    sa_storage.__ss_padding[0x5c] = '\0';
    sa_storage.__ss_padding[0x5d] = '\0';
    sa_storage.__ss_padding[0x5e] = '\0';
    sa_storage.__ss_padding[0x5f] = '\0';
    sa_storage.__ss_padding[0x60] = '\0';
    sa_storage.__ss_padding[0x61] = '\0';
    sa_storage.__ss_padding[0x62] = '\0';
    sa_storage.__ss_padding[99] = '\0';
    sa_storage.__ss_padding[100] = '\0';
    sa_storage.__ss_padding[0x65] = '\0';
    sa_storage.__ss_padding[0x66] = '\0';
    sa_storage.__ss_padding[0x67] = '\0';
    sa_storage.__ss_padding[0x68] = '\0';
    sa_storage.__ss_padding[0x69] = '\0';
    sa_storage.__ss_padding[0x6a] = '\0';
    sa_storage.__ss_padding[0x6b] = '\0';
    sa_storage.__ss_padding[0x6c] = '\0';
    sa_storage.__ss_padding[0x6d] = '\0';
    sa_storage.__ss_padding[0x6e] = '\0';
    sa_storage.__ss_padding[0x6f] = '\0';
    sa_storage.__ss_padding[0x70] = '\0';
    sa_storage.__ss_padding[0x71] = '\0';
    sa_storage.__ss_padding[0x72] = '\0';
    sa_storage.__ss_padding[0x73] = '\0';
    sa_storage.__ss_padding[0x74] = '\0';
    sa_storage.__ss_padding[0x75] = '\0';
    sa_storage.__ss_align = 0;
    aVar1 = ares_socket_recvfrom
                      (channel,conn->fd,ARES_FALSE,data,len,0,(sockaddr *)&sa_storage,&salen,
                       read_bytes);
    if (aVar1 == ARES_CONN_ERR_SUCCESS) {
      aVar2 = ares_sockaddr_addr_eq((sockaddr *)&sa_storage,&conn->server->addr);
      aVar1 = (ares_conn_err_t)(aVar2 == ARES_FALSE);
    }
  }
  else {
    aVar1 = ares_socket_recv(channel,conn->fd,ARES_TRUE,data,len,read_bytes);
  }
  if (aVar1 == ARES_CONN_ERR_SUCCESS) {
    *(undefined1 *)&conn->state_flags = (char)conn->state_flags | ARES_CONN_STATE_CONNECTED;
  }
  return aVar1;
}

Assistant:

ares_conn_err_t ares_conn_read(ares_conn_t *conn, void *data, size_t len,
                               size_t *read_bytes)
{
  ares_channel_t *channel = conn->server->channel;
  ares_conn_err_t err;

  if (!(conn->flags & ARES_CONN_FLAG_TCP)) {
    struct sockaddr_storage sa_storage;
    ares_socklen_t          salen = sizeof(sa_storage);

    memset(&sa_storage, 0, sizeof(sa_storage));

    err =
      ares_socket_recvfrom(channel, conn->fd, ARES_FALSE, data, len, 0,
                           (struct sockaddr *)&sa_storage, &salen, read_bytes);

#ifdef HAVE_RECVFROM
    if (err == ARES_CONN_ERR_SUCCESS &&
        !ares_sockaddr_addr_eq((struct sockaddr *)&sa_storage,
                               &conn->server->addr)) {
      err = ARES_CONN_ERR_WOULDBLOCK;
    }
#endif
  } else {
    err = ares_socket_recv(channel, conn->fd, ARES_TRUE, data, len, read_bytes);
  }

  /* Toggle connected state if needed */
  if (err == ARES_CONN_ERR_SUCCESS) {
    conn->state_flags |= ARES_CONN_STATE_CONNECTED;
  }

  return err;
}